

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>>,Eigen::internal::mul_assign_op<float,float>>
               (Matrix<float,_3,_1,_0,_3,_1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
               *src,mul_assign_op<float,_float> *func)

{
  SrcEvaluatorType func_00;
  Matrix<float,_3,_1,_0,_3,_1> *dstExpr;
  undefined1 local_60 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_28;
  SrcEvaluatorType srcEvaluator;
  mul_assign_op<float,_float> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  *src_local;
  Matrix<float,_3,_1,_0,_3,_1> *dst_local;
  
  srcEvaluator = (SrcEvaluatorType)func;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::evaluator(&local_28,src);
  resize_if_allowed<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>>,Eigen::internal::mul_assign_op<float,float>>
            (dst,src,(mul_assign_op<float,_float> *)srcEvaluator);
  evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator;
  dstExpr = EigenBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
              *)local_60,(DstEvaluatorType *)&kernel.m_dstExpr,&local_28,
             (mul_assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>,_3,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
         *)local_60);
  evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::~evaluator(&local_28);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}